

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O1

int getfield(lua_State *L,char *key,int d,int delta)

{
  int iVar1;
  undefined8 in_RAX;
  lua_Integer lVar2;
  char *fmt;
  int isnum;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = lua_getfield(L,-1,key);
  lVar2 = lua_tointegerx(L,-1,&local_34);
  if (local_34 == 0) {
    if (iVar1 == 0) {
      if (-1 < d) goto LAB_00113756;
      fmt = "field \'%s\' missing in date table";
    }
    else {
      fmt = "field \'%s\' is not an integer";
    }
LAB_0011377d:
    d = luaL_error(L,fmt,key);
  }
  else {
    if (lVar2 < 0) {
      if (lVar2 < (int)(delta | 0x80000000)) goto LAB_00113776;
    }
    else if (0x7fffffff < (long)(lVar2 - (ulong)(uint)delta)) {
LAB_00113776:
      fmt = "field \'%s\' is out-of-bound";
      goto LAB_0011377d;
    }
    d = (int)lVar2 - delta;
LAB_00113756:
    lua_settop(L,-2);
  }
  return d;
}

Assistant:

static int getfield (lua_State *L, const char *key, int d, int delta) {
  int isnum;
  int t = lua_getfield(L, -1, key);  /* get field and its type */
  lua_Integer res = lua_tointegerx(L, -1, &isnum);
  if (!isnum) {  /* field is not an integer? */
    if (l_unlikely(t != LUA_TNIL))  /* some other value? */
      return luaL_error(L, "field '%s' is not an integer", key);
    else if (l_unlikely(d < 0))  /* absent field; no default? */
      return luaL_error(L, "field '%s' missing in date table", key);
    res = d;
  }
  else {
    if (!(res >= 0 ? res - delta <= INT_MAX : INT_MIN + delta <= res))
      return luaL_error(L, "field '%s' is out-of-bound", key);
    res -= delta;
  }
  lua_pop(L, 1);
  return (int)res;
}